

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.hpp
# Opt level: O2

uint __thiscall
Lib::
BinaryHeap<FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator_*,_FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator_Compare>
::bubbleUp(BinaryHeap<FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator_*,_FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator_Compare>
           *this,uint index)

{
  Constraint_Generator **ppCVar1;
  Constraint_Generator *pCVar2;
  ulong uVar3;
  ulong uVar4;
  Constraint_Generator *__tmp;
  
  uVar4 = (ulong)index;
  while( true ) {
    if ((uint)uVar4 < 2) {
      return 1;
    }
    uVar3 = uVar4 >> 1;
    ppCVar1 = this->_data1;
    pCVar2 = ppCVar1[uVar4];
    if (ppCVar1[uVar3]->_weight <= pCVar2->_weight) break;
    ppCVar1[uVar4] = ppCVar1[uVar3];
    ppCVar1[uVar3] = pCVar2;
    uVar4 = uVar3;
  }
  return (uint)uVar4;
}

Assistant:

unsigned bubbleUp(unsigned index)
  {
    ASS(index>0 && index<=_size);
    unsigned nextIndex=index>>1;
    while(nextIndex) {
      if(Comparator::compare(_data1[index], _data1[nextIndex])==LESS) {
	std::swap(_data1[index], _data1[nextIndex]);
      } else {
	return index;
      }
      index=nextIndex;
      nextIndex=index>>1;
    }
    return 1;
  }